

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zaxpy.c
# Opt level: O1

void zaxpy_(integer *n,doublecomplex *za,doublecomplex *zx,integer *incx,doublecomplex *zy,
           integer *incy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  double *pdVar11;
  long lVar12;
  double *pdVar13;
  doublereal dVar14;
  
  if (0 < *n) {
    dVar14 = dcabs1_(za);
    if ((dVar14 != 0.0) || (NAN(dVar14))) {
      iVar6 = *incx;
      if (((long)iVar6 == 1) && (*incy == 1)) {
        uVar7 = *n;
        if (0 < (int)uVar7) {
          lVar9 = 0;
          do {
            dVar1 = za->r;
            dVar2 = za->i;
            dVar3 = *(double *)((long)&zx->r + lVar9);
            dVar4 = *(double *)((long)&zx->i + lVar9);
            *(double *)((long)&zy->r + lVar9) =
                 (dVar1 * dVar3 - dVar4 * dVar2) + *(double *)((long)&zy->r + lVar9);
            *(double *)((long)&zy->i + lVar9) =
                 dVar1 * dVar4 + dVar3 * dVar2 + *(double *)((long)&zy->i + lVar9);
            lVar9 = lVar9 + 0x10;
          } while ((ulong)uVar7 << 4 != lVar9);
        }
      }
      else {
        lVar12 = 1;
        lVar9 = 1;
        if (iVar6 < 0) {
          lVar9 = (long)((1 - *n) * iVar6 + 1);
        }
        iVar8 = *incy;
        if ((long)iVar8 < 0) {
          lVar12 = (long)((1 - *n) * iVar8 + 1);
        }
        iVar10 = *n;
        if (0 < iVar10) {
          pdVar11 = &zx[lVar9 + -1].i;
          pdVar13 = &zy[lVar12 + -1].i;
          do {
            dVar1 = za->r;
            dVar2 = za->i;
            dVar3 = ((doublecomplex *)(pdVar11 + -1))->r;
            dVar4 = *pdVar11;
            dVar5 = *pdVar13;
            ((doublecomplex *)(pdVar13 + -1))->r =
                 (dVar1 * dVar3 - dVar4 * dVar2) + ((doublecomplex *)(pdVar13 + -1))->r;
            *pdVar13 = dVar1 * dVar4 + dVar3 * dVar2 + dVar5;
            pdVar11 = pdVar11 + (long)iVar6 * 2;
            pdVar13 = pdVar13 + (long)iVar8 * 2;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
      }
    }
  }
  return;
}

Assistant:

void zaxpy_(integer *n, doublecomplex *za, doublecomplex *zx, 
	integer *incx, doublecomplex *zy, integer *incy)
{


    /* System generated locals */

    doublecomplex z__1, z__2;

    /* Local variables */
    integer i;
    extern doublereal dcabs1_(doublecomplex *);
    integer ix, iy;


/*     constant times a vector plus a vector.   
       jack dongarra, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   

    
   Parameter adjustments   
       Function Body */
#define ZY(I) zy[(I)-1]
#define ZX(I) zx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (dcabs1_(za) == 0.) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	z__2.r = za->r * ZX(ix).r - za->i * ZX(ix).i, z__2.i = za->r * ZX(
		ix).i + za->i * ZX(ix).r;
	z__1.r = ZY(iy).r + z__2.r, z__1.i = ZY(iy).i + z__2.i;
	ZY(iy).r = z__1.r, ZY(iy).i = z__1.i;
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1 */

L20:
    for (i = 1; i <= *n; ++i) {
	z__2.r = za->r * ZX(i).r - za->i * ZX(i).i, z__2.i = za->r * ZX(
		i).i + za->i * ZX(i).r;
	z__1.r = ZY(i).r + z__2.r, z__1.i = ZY(i).i + z__2.i;
	ZY(i).r = z__1.r, ZY(i).i = z__1.i;
/* L30: */
    }
    return;
}